

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav * drwav_open_file_write__internal
                  (char *filename,drwav_data_format *pFormat,drwav_uint64 totalSampleCount,
                  drwav_bool32 isSequential)

{
  FILE *__stream;
  drwav *pdVar1;
  
  __stream = fopen(filename,"wb");
  if (__stream != (FILE *)0x0) {
    pdVar1 = drwav_open_write__internal
                       (pFormat,totalSampleCount,isSequential,drwav__on_write_stdio,
                        drwav__on_seek_stdio,__stream);
    if (pdVar1 != (drwav *)0x0) {
      return pdVar1;
    }
    fclose(__stream);
  }
  return (drwav *)0x0;
}

Assistant:

drwav* drwav_open_file_write__internal(const char* filename, const drwav_data_format* pFormat, drwav_uint64 totalSampleCount, drwav_bool32 isSequential)
{
    FILE* pFile = drwav_fopen(filename, "wb");
    if (pFile == NULL) {
        return DRWAV_FALSE;
    }

    drwav* pWav = drwav_open_write__internal(pFormat, totalSampleCount, isSequential, drwav__on_write_stdio, drwav__on_seek_stdio, (void*)pFile);
    if (pWav == NULL) {
        fclose(pFile);
        return NULL;
    }

    return pWav;
}